

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to1.h
# Opt level: O0

void ncnn::deconvolution_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar9;
  undefined1 auVar10 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _w;
  __m512 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  float local_984;
  int local_830;
  int local_824;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined4 local_808;
  long local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  int local_7d4;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  long local_7b0;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined8 local_790;
  long local_788;
  undefined1 local_780 [64];
  float local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  float *local_6c0;
  int local_6b4;
  long local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  long *local_688;
  long *local_680;
  long *local_678;
  undefined8 *local_670;
  undefined1 local_665;
  int local_664;
  undefined8 *local_658;
  undefined8 *local_648;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_600;
  undefined8 *local_5e0;
  undefined8 *local_5c0;
  undefined1 local_5a5;
  int local_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_575;
  int local_574;
  undefined8 *local_568;
  undefined8 *local_548;
  int local_534;
  undefined8 *local_530;
  float local_524;
  float local_520;
  float local_51c;
  float local_518;
  float local_514;
  float local_510;
  float local_50c;
  float local_508;
  float local_504;
  long *local_500;
  int local_4f8;
  float local_4f4 [3];
  long *local_4e8;
  undefined8 local_4e0;
  long *local_4d8;
  undefined8 local_4d0;
  long *local_4c8;
  undefined8 local_4c0;
  long *local_4b8;
  undefined8 local_4b0;
  long *local_4a8;
  long local_4a0;
  undefined4 local_494;
  long local_490;
  long local_488;
  undefined4 local_47c;
  int local_478;
  int local_474;
  undefined8 *local_470;
  long local_468;
  undefined4 local_45c;
  long local_458;
  long local_450;
  undefined4 local_444;
  int local_440;
  int local_43c;
  undefined8 *local_438;
  long local_430;
  undefined4 local_424;
  long local_420;
  float *local_418;
  undefined4 local_40c;
  int local_408;
  int local_404;
  undefined8 *local_400;
  undefined4 local_3f4;
  long local_3f0;
  undefined4 local_3e4;
  long local_3e0;
  undefined4 local_3d4;
  long local_3d0;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 (*local_310) [64];
  undefined1 (*local_308) [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  ulong local_210;
  undefined8 uStack_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  undefined1 local_70 [16];
  ulong local_60;
  undefined8 uStack_58;
  
  local_69c = (int)in_RSI[7];
  local_6a0 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_6a4 = dilation_w * (in_R9D + -1) + 1;
  local_6b0 = *in_RCX;
  local_698 = in_R9D;
  local_694 = in_R8D;
  local_688 = in_RDX;
  local_680 = in_RSI;
  local_678 = in_RDI;
  for (local_6b4 = 0; local_6b4 < local_69c; local_6b4 = local_6b4 + 1) {
    local_658 = &local_708;
    local_404 = *(int *)((long)local_680 + 0x2c);
    local_408 = (int)local_680[6];
    local_40c = *(undefined4 *)((long)local_680 + 0x34);
    local_6c0 = (float *)(*local_680 + local_680[8] * (long)local_6b4 * local_680[2]);
    local_420 = local_680[2];
    local_424 = (undefined4)local_680[3];
    local_430 = local_680[4];
    local_400 = &local_708;
    local_3f0 = (long)local_404 * (long)local_408 * local_420;
    local_670 = &local_708;
    local_648 = &local_708;
    local_3f4 = 0x10;
    local_664 = local_6b4;
    local_665 = 1;
    local_708 = 0;
    local_6f8 = 0;
    local_6f0 = 0;
    local_6e0 = 0;
    local_6dc = 0;
    local_6d8 = 0;
    local_6d4 = 0;
    local_6d0 = 0;
    local_6c8 = 0;
    local_700 = 0;
    local_718 = local_694 * local_698;
    local_71c = *(int *)((long)local_678 + 0x2c);
    local_720 = (int)local_678[6];
    local_724 = (int)local_678[7];
    local_728 = *(int *)((long)local_680 + 0x2c);
    local_72c = (int)local_680[6];
    local_5c0 = local_648;
    local_418 = local_6c0;
    local_6e8 = local_430;
    for (local_730 = 0; local_730 < local_72c; local_730 = local_730 + 1) {
      for (local_734 = 0; local_734 < local_728; local_734 = local_734 + 1) {
        local_738 = 0.0;
        if (local_6b0 != 0) {
          local_738 = *(float *)(local_6b0 + (long)local_6b4 * 4);
        }
        local_780 = ZEXT1664(ZEXT816(0));
        local_568 = &local_7d0;
        local_474 = *(int *)((long)local_688 + 0x2c);
        local_478 = (int)local_688[6];
        local_47c = *(undefined4 *)((long)local_688 + 0x34);
        local_488 = *local_688 + local_688[8] * (long)local_6b4 * local_688[2];
        local_490 = local_688[2];
        local_494 = (undefined4)local_688[3];
        local_4a0 = local_688[4];
        local_470 = &local_7d0;
        local_3d0 = (long)local_474 * (long)local_478 * local_490;
        local_548 = &local_7d0;
        local_638 = &local_7d0;
        uStack_348 = 0;
        uStack_350 = 0;
        uStack_358 = 0;
        uStack_360 = 0;
        uStack_368 = 0;
        uStack_370 = 0;
        uStack_378 = 0;
        local_380 = 0;
        local_3d4 = 0x10;
        local_574 = local_6b4;
        local_575 = 1;
        local_7d0 = 0;
        local_7c0 = 0;
        local_7b8 = 0;
        local_7a8 = 0;
        local_7a4 = 0;
        local_7a0 = 0;
        local_79c = 0;
        local_798 = 0;
        local_790 = 0;
        local_7c8 = 0;
        local_788 = local_488;
        for (local_7d4 = 0; local_7d4 < local_724; local_7d4 = local_7d4 + 1) {
          local_43c = *(int *)((long)local_678 + 0x2c);
          local_440 = (int)local_678[6];
          local_444 = *(undefined4 *)((long)local_678 + 0x34);
          local_450 = *local_678 + local_678[8] * (long)local_7d4 * local_678[2];
          local_458 = local_678[2];
          local_45c = (undefined4)local_678[3];
          local_468 = local_678[4];
          local_438 = &local_820;
          local_3e0 = (long)local_43c * (long)local_440 * local_458;
          for (local_824 = 0; local_824 < local_698; local_824 = local_824 + 1) {
            iVar6 = (local_730 + local_824 * dilation_w) - (local_6a4 + -1);
            if (((-1 < iVar6) && (iVar6 % stride_w == 0)) &&
               (iVar6 = iVar6 / stride_w, iVar6 < local_720)) {
              for (local_830 = 0; local_830 < local_694; local_830 = local_830 + 1) {
                iVar7 = (local_734 + local_830 * in_stack_00000008) - (local_6a0 + -1);
                if (((-1 < iVar7) && (iVar7 % dilation_h == 0)) && (iVar7 / dilation_h < local_71c))
                {
                  local_530 = &local_820;
                  local_308 = (undefined1 (*) [64])
                              (local_450 + (long)local_43c * (long)iVar6 * local_458 +
                              (long)(iVar7 / dilation_h << 4) * 4);
                  local_280 = *(undefined8 *)*local_308;
                  uStack_278 = *(undefined8 *)(*local_308 + 8);
                  uStack_270 = *(undefined8 *)(*local_308 + 0x10);
                  uStack_268 = *(undefined8 *)(*local_308 + 0x18);
                  uStack_260 = *(undefined8 *)(*local_308 + 0x20);
                  uStack_258 = *(undefined8 *)(*local_308 + 0x28);
                  uStack_250 = *(undefined8 *)(*local_308 + 0x30);
                  uStack_248 = *(undefined8 *)(*local_308 + 0x38);
                  local_310 = (undefined1 (*) [64])
                              (local_788 + (long)((local_824 * local_694 + local_830) * 0x10) * 4);
                  local_2c0 = *(undefined8 *)*local_310;
                  uStack_2b8 = *(undefined8 *)(*local_310 + 8);
                  uStack_2b0 = *(undefined8 *)(*local_310 + 0x10);
                  uStack_2a8 = *(undefined8 *)(*local_310 + 0x18);
                  uStack_2a0 = *(undefined8 *)(*local_310 + 0x20);
                  uStack_298 = *(undefined8 *)(*local_310 + 0x28);
                  uStack_290 = *(undefined8 *)(*local_310 + 0x30);
                  uStack_288 = *(undefined8 *)(*local_310 + 0x38);
                  local_300 = local_780._0_8_;
                  uStack_2f8 = local_780._8_8_;
                  uStack_2f0 = local_780._16_8_;
                  uStack_2e8 = local_780._24_8_;
                  uStack_2e0 = local_780._32_8_;
                  uStack_2d8 = local_780._40_8_;
                  uStack_2d0 = local_780._48_8_;
                  uStack_2c8 = local_780._56_8_;
                  local_780 = vfmadd213ps_avx512f(*local_310,*local_308,local_780);
                  local_534 = iVar6;
                }
              }
            }
          }
          local_788 = local_788 + (long)(local_718 << 4) * 4;
          local_628 = &local_820;
          local_3e4 = 0x10;
          local_5a4 = local_7d4;
          local_5a5 = 1;
          local_820 = 0;
          local_810 = 0;
          local_808 = 0;
          local_7f8 = 0;
          local_7f4 = 0;
          local_7f0 = 0;
          local_7ec = 0;
          local_7e8 = 0;
          local_7e0 = 0;
          local_818 = 0;
          local_600 = local_628;
          local_800 = local_468;
        }
        local_1c0 = local_780._0_8_;
        uStack_1b8 = local_780._8_8_;
        uStack_1b0 = local_780._16_8_;
        uStack_1a8 = local_780._24_8_;
        uStack_1a0 = local_780._32_8_;
        uStack_198 = local_780._40_8_;
        uStack_190 = local_780._48_8_;
        uStack_188 = local_780._56_8_;
        local_100 = local_780._0_8_;
        uStack_f8 = local_780._8_8_;
        uStack_f0 = local_780._16_8_;
        uStack_e8 = local_780._24_8_;
        uStack_e0 = local_780._32_8_;
        uStack_d8 = local_780._40_8_;
        uStack_d0 = local_780._48_8_;
        uStack_c8 = local_780._56_8_;
        local_160 = local_780._0_8_;
        uVar2 = local_160;
        uStack_158 = local_780._8_8_;
        uVar3 = uStack_158;
        uStack_150 = local_780._16_8_;
        uVar4 = uStack_150;
        uStack_148 = local_780._24_8_;
        uVar5 = uStack_148;
        local_5a0 = vextractf64x4_avx512f(local_780,1);
        local_160._0_4_ = local_780._0_4_;
        local_160._4_4_ = local_780._4_4_;
        uStack_158._0_4_ = local_780._8_4_;
        uStack_158._4_4_ = local_780._12_4_;
        uStack_150._0_4_ = local_780._16_4_;
        uStack_150._4_4_ = local_780._20_4_;
        uStack_148._0_4_ = local_780._24_4_;
        uStack_148._4_4_ = local_780._28_4_;
        local_1e0 = (float)local_160 + local_180;
        fStack_1dc = local_160._4_4_ + fStack_17c;
        fStack_1d8 = (float)uStack_158 + fStack_178;
        fStack_1d4 = uStack_158._4_4_ + fStack_174;
        fStack_1d0 = (float)uStack_150 + fStack_170;
        fStack_1cc = uStack_150._4_4_ + fStack_16c;
        fStack_1c8 = (float)uStack_148 + fStack_168;
        fStack_1c4 = uStack_148._4_4_ + fStack_164;
        local_c0 = CONCAT44(fStack_1dc,local_1e0);
        uStack_b8 = CONCAT44(fStack_1d4,fStack_1d8);
        uStack_b0 = CONCAT44(fStack_1cc,fStack_1d0);
        uStack_a8 = CONCAT44(fStack_1c4,fStack_1c8);
        uStack_108 = CONCAT44(fStack_1c4,fStack_1c8);
        local_110 = CONCAT44(fStack_1cc,fStack_1d0);
        local_1f0 = fStack_1d0 + local_120;
        fStack_1ec = fStack_1cc + fStack_11c;
        fStack_1e8 = fStack_1c8 + fStack_118;
        fStack_1e4 = fStack_1c4 + fStack_114;
        local_130 = CONCAT44(fStack_1ec,local_1f0);
        uStack_128 = CONCAT44(fStack_1e4,fStack_1e8);
        auVar1._8_8_ = uStack_128;
        auVar1._0_8_ = local_130;
        auVar10._8_8_ = uStack_128;
        auVar10._0_8_ = local_130;
        _local_140 = vunpckhpd_avx(auVar10,auVar1);
        local_200 = local_1f0 + (float)local_140._0_4_;
        fStack_1fc = fStack_1ec + (float)local_140._4_4_;
        fStack_1f8 = fStack_1e8 + fStack_138;
        fStack_1f4 = fStack_1e4 + fStack_134;
        local_70._0_4_ = local_200 + fStack_1fc;
        auVar10 = ZEXT416((uint)local_70._0_4_);
        local_70._4_4_ = 0;
        local_210 = local_70._0_8_;
        uStack_208 = 0;
        local_60 = local_70._0_8_;
        uStack_58 = 0;
        local_984 = local_738 + (float)local_70._0_4_;
        local_500 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_4f8 = stride_h;
        local_4f4[0] = local_984;
        local_738 = local_984;
        local_5e0 = local_638;
        local_160 = uVar2;
        uStack_158 = uVar3;
        uStack_150 = uVar4;
        uStack_148 = uVar5;
        local_a0 = local_130;
        uStack_98 = uStack_128;
        local_90 = local_130;
        uStack_88 = uStack_128;
        local_80 = fStack_1fc;
        fStack_7c = fStack_1fc;
        fStack_78 = fStack_1fc;
        fStack_74 = fStack_1fc;
        local_70 = auVar10;
        local_7b0 = local_4a0;
        switch(stride_h) {
        case 1:
          dVar9 = std::fmax((double)(ulong)(uint)local_984,0.0);
          local_4f4[0] = SUB84(dVar9,0);
          break;
        case 2:
          local_4b0 = 0;
          local_504 = *(float *)*local_500;
          if (local_984 <= 0.0) {
            local_984 = local_984 * local_504;
          }
          local_4f4[0] = local_984;
          local_4a8 = local_500;
          break;
        case 3:
          local_4c0 = 0;
          local_508 = *(float *)*local_500;
          local_4d0 = 1;
          local_50c = *(float *)(*local_500 + 4);
          if (local_984 < local_508) {
            local_4f4[0] = local_508;
          }
          local_4c8 = local_500;
          local_4b8 = local_500;
          if (local_50c < local_4f4[0]) {
            local_4f4[0] = local_50c;
          }
          break;
        case 4:
          local_510 = 88.37626;
          pfVar8 = std::min<float>(local_4f4,&local_510);
          local_4f4[0] = *pfVar8;
          local_514 = -88.37626;
          pfVar8 = std::max<float>(local_4f4,&local_514);
          local_4f4[0] = *pfVar8;
          dVar9 = std::exp((double)(ulong)(uint)-local_4f4[0]);
          local_4f4[0] = 1.0 / (SUB84(dVar9,0) + 1.0);
          break;
        case 5:
          dVar9 = std::exp((double)(ulong)(uint)local_984);
          dVar9 = std::log((double)(ulong)(uint)(SUB84(dVar9,0) + 1.0));
          dVar9 = std::tanh(dVar9);
          local_4f4[0] = local_984 * SUB84(dVar9,0);
          break;
        case 6:
          local_4e0 = 0;
          local_518 = *(float *)*local_500;
          local_4f4[1] = 1.4013e-45;
          local_4f4[2] = 0.0;
          local_51c = *(float *)(*local_500 + 4);
          local_520 = -local_51c / local_518;
          local_524 = 1.0 / local_518 + local_520;
          local_4e8 = local_500;
          local_4d8 = local_500;
          if (local_520 <= local_984) {
            if (local_984 <= local_524) {
              local_4f4[0] = local_984 * (local_984 * local_518 + local_51c);
            }
          }
          else {
            local_4f4[0] = 0.0;
          }
        }
        *local_6c0 = local_4f4[0];
        local_6c0 = local_6c0 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m512 _sum = _mm512_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = y * kernel_w + x;

                            __m512 _val = _mm512_load_ps(sptr);
                            __m512 _w = _mm512_load_ps(kptr + k * 16);
                            _sum = _mm512_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                sum += _mm512_comp_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}